

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::ConstructorOp::~ConstructorOp(ConstructorOp *this)

{
  bool bVar1;
  reference ppEVar2;
  __normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
  local_20;
  __normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
  local_18;
  iterator i;
  ConstructorOp *this_local;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__ConstructorOp_032ea168;
  i._M_current = (Expression **)this;
  local_18._M_current =
       (Expression **)
       std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::begin
                 (&this->m_inputExpressions);
  while( true ) {
    local_20._M_current =
         (Expression **)
         std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::end
                   (&this->m_inputExpressions);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
              ::operator*(&local_18);
    if (*ppEVar2 != (Expression *)0x0) {
      (*(*ppEVar2)->_vptr_Expression[1])();
    }
    __gnu_cxx::
    __normal_iterator<rsg::Expression_**,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
    ::operator++(&local_18,0);
  }
  std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::~vector
            (&this->m_inputExpressions);
  std::vector<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>::~vector(&this->m_inputValueRanges)
  ;
  ValueStorage<64>::~ValueStorage(&this->m_value);
  ValueRange::~ValueRange(&this->m_valueRange);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

ConstructorOp::~ConstructorOp (void)
{
	for (vector<Expression*>::iterator i = m_inputExpressions.begin(); i != m_inputExpressions.end(); i++)
		delete *i;
}